

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpsocketengine.cpp
# Opt level: O0

void __thiscall QHttpSocketEngine::slotSocketError(QHttpSocketEngine *this,SocketError error)

{
  QHttpSocketEnginePrivate *file;
  QDebug *o;
  SocketError in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QHttpSocketEnginePrivate *d;
  int in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff20;
  SocketError error_00;
  QString *this_00;
  QDebug local_b0;
  QDebug in_stack_ffffffffffffff58;
  QDebug local_a0 [19];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  file = d_func((QHttpSocketEngine *)0x33b674);
  if (file->state == Connected) {
    if (in_ESI != SocketTimeoutError) {
      file->state = None;
      error_00 = in_ESI;
      QIODevice::errorString();
      QAbstractSocketEngine::setError
                ((QAbstractSocketEngine *)CONCAT44(error_00,in_stack_ffffffffffffff20),
                 (SocketError)((ulong)file >> 0x20),in_RDI);
      QString::~QString((QString *)0x33b860);
      if (error_00 != RemoteHostClosedError) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(error_00,in_stack_ffffffffffffff20),(char *)file,
                   (int)((ulong)in_RDI >> 0x20),(char *)CONCAT44(in_stack_ffffffffffffff0c,in_ESI));
        QMessageLogger::debug();
        o = QDebug::operator<<((QDebug *)this_00,(char *)in_stack_ffffffffffffff58.stream);
        QDebug::QDebug((QDebug *)&stack0xffffffffffffff58,o);
        ::operator<<((QDebug *)this_00,error_00);
        QDebug::~QDebug(local_a0);
        QDebug::~QDebug((QDebug *)&stack0xffffffffffffff58);
        QDebug::~QDebug(&local_b0);
      }
      emitReadNotification((QHttpSocketEngine *)in_RDI);
    }
  }
  else {
    if (in_ESI == HostNotFoundError) {
      tr((char *)file,(char *)in_RDI,in_stack_ffffffffffffff0c);
      QAbstractSocketEngine::setError
                ((QAbstractSocketEngine *)CONCAT44(in_ESI,in_stack_ffffffffffffff20),
                 (SocketError)((ulong)file >> 0x20),in_RDI);
      QString::~QString((QString *)0x33b6d3);
    }
    else if (in_ESI == ConnectionRefusedError) {
      tr((char *)file,(char *)in_RDI,in_stack_ffffffffffffff0c);
      QAbstractSocketEngine::setError
                ((QAbstractSocketEngine *)CONCAT44(in_ESI,in_stack_ffffffffffffff20),
                 (SocketError)((ulong)file >> 0x20),in_RDI);
      QString::~QString((QString *)0x33b720);
    }
    else if (in_ESI == SocketTimeoutError) {
      tr((char *)file,(char *)in_RDI,in_stack_ffffffffffffff0c);
      QAbstractSocketEngine::setError
                ((QAbstractSocketEngine *)CONCAT44(in_ESI,in_stack_ffffffffffffff20),
                 (SocketError)((ulong)file >> 0x20),in_RDI);
      QString::~QString((QString *)0x33b76d);
    }
    else if (in_ESI == RemoteHostClosedError) {
      tr((char *)file,(char *)in_RDI,in_stack_ffffffffffffff0c);
      QAbstractSocketEngine::setError
                ((QAbstractSocketEngine *)CONCAT44(in_ESI,in_stack_ffffffffffffff20),
                 (SocketError)((ulong)file >> 0x20),in_RDI);
      QString::~QString((QString *)0x33b7ba);
    }
    else {
      QIODevice::errorString();
      QAbstractSocketEngine::setError
                ((QAbstractSocketEngine *)CONCAT44(in_ESI,in_stack_ffffffffffffff20),
                 (SocketError)((ulong)file >> 0x20),in_RDI);
      QString::~QString((QString *)0x33b7f7);
    }
    emitConnectionNotification((QHttpSocketEngine *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpSocketEngine::slotSocketError(QAbstractSocket::SocketError error)
{
    Q_D(QHttpSocketEngine);

    if (d->state != Connected) {
        // we are in proxy handshaking stages
        if (error == QAbstractSocket::HostNotFoundError)
            setError(QAbstractSocket::ProxyNotFoundError, tr("Proxy server not found"));
        else if (error == QAbstractSocket::ConnectionRefusedError)
            setError(QAbstractSocket::ProxyConnectionRefusedError, tr("Proxy connection refused"));
        else if (error == QAbstractSocket::SocketTimeoutError)
            setError(QAbstractSocket::ProxyConnectionTimeoutError, tr("Proxy server connection timed out"));
        else if (error == QAbstractSocket::RemoteHostClosedError)
            setError(QAbstractSocket::ProxyConnectionClosedError, tr("Proxy connection closed prematurely"));
        else
            setError(error, d->socket->errorString());
        emitConnectionNotification();
        return;
    }

    // We're connected
    if (error == QAbstractSocket::SocketTimeoutError)
        return;                 // ignore this error

    d->state = None;
    setError(error, d->socket->errorString());
    if (error != QAbstractSocket::RemoteHostClosedError)
        qDebug() << "QHttpSocketEngine::slotSocketError: got weird error =" << error;
    //read notification needs to always be emitted, otherwise the higher layer doesn't get the disconnected signal
    emitReadNotification();
}